

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeTessellationTests.cpp
# Opt level: O3

void deqp::gles31::Functional::NegativeTestShared::single_tessellation_stage
               (NegativeTestContext *ctx)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  RenderContext *pRVar4;
  bool bVar5;
  bool bVar6;
  ContextType ctxType;
  char *__s;
  mapped_type *pmVar7;
  TestError *pTVar8;
  GLenum error;
  long lVar9;
  char *pcVar10;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  args;
  ShaderProgram program;
  string local_340;
  string local_320;
  string local_300;
  string local_2e0;
  string local_2c0;
  string local_2a0;
  string local_280;
  string local_260;
  StringTemplate local_240;
  StringTemplate local_220;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_200;
  undefined1 local_1d0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0 [4];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_140;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_120;
  bool local_108;
  undefined1 local_100 [152];
  GLuint local_68;
  bool local_40;
  
  ctxType.super_ApiType.m_bits = (ApiType)(*ctx->m_renderCtx->_vptr_RenderContext[2])();
  bVar5 = glu::contextSupports(ctxType,(ApiType)0x23);
  bVar6 = glu::ContextInfo::isExtensionSupported(ctx->m_ctxInfo,"GL_NV_gpu_shader5");
  local_200._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_200._M_impl.super__Rb_tree_header._M_header;
  local_200._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_200._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_200._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_200._M_impl.super__Rb_tree_header._M_header._M_right =
       local_200._M_impl.super__Rb_tree_header._M_header._M_left;
  __s = glu::getGLSLVersionDeclaration(bVar5 | GLSL_VERSION_310_ES);
  pcVar1 = local_100 + 0x10;
  local_100._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_100,"GLSL_VERSION_STRING","");
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&local_200,(key_type *)local_100);
  pcVar10 = (char *)pmVar7->_M_string_length;
  strlen(__s);
  std::__cxx11::string::_M_replace((ulong)pmVar7,0,pcVar10,(ulong)__s);
  if ((pointer)local_100._0_8_ != pcVar1) {
    operator_delete((void *)local_100._0_8_,local_100._16_8_ + 1);
  }
  pcVar10 = "#extension GL_EXT_tessellation_shader : require";
  if (bVar5) {
    pcVar10 = "";
  }
  local_100._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_100,"GLSL_TESS_EXTENSION_STRING","");
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&local_200,(key_type *)local_100);
  std::__cxx11::string::_M_replace((ulong)pmVar7,0,(char *)pmVar7->_M_string_length,(ulong)pcVar10);
  if ((pointer)local_100._0_8_ != pcVar1) {
    operator_delete((void *)local_100._0_8_,local_100._16_8_ + 1);
  }
  checkTessellationSupport((NegativeTestContext *)ctx->m_ctxInfo);
  pRVar4 = ctx->m_renderCtx;
  local_320._M_dataplus._M_p = (pointer)&local_320.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_320,
             "${GLSL_VERSION_STRING}\n\nvoid main (void)\n{\n\tgl_Position = vec4(0.0);\n}\n","");
  tcu::StringTemplate::StringTemplate(&local_220,&local_320);
  tcu::StringTemplate::specialize
            (&local_2c0,&local_220,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&local_200);
  local_340._M_dataplus._M_p = (pointer)&local_340.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_340,
             "${GLSL_VERSION_STRING}\nprecision mediump float;\nlayout(location = 0) out mediump vec4 fragColor;\n\nvoid main (void)\n{\n\tfragColor = vec4(1.0);\n}\n"
             ,"");
  tcu::StringTemplate::StringTemplate(&local_240,&local_340);
  tcu::StringTemplate::specialize
            (&local_2e0,&local_240,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&local_200);
  paVar2 = &local_280.field_2;
  local_280._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_280,
             "${GLSL_VERSION_STRING}\n${GLSL_TESS_EXTENSION_STRING}\nlayout (vertices=3) out;\n\nvoid main()\n{\n\tgl_out[gl_InvocationID].gl_Position = gl_in[gl_InvocationID].gl_Position;\n}\n"
             ,"");
  tcu::StringTemplate::StringTemplate((StringTemplate *)&local_260,&local_280);
  tcu::StringTemplate::specialize
            (&local_300,(StringTemplate *)&local_260,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&local_200);
  paVar3 = &local_2a0.field_2;
  local_2a0._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a0,0x96985f);
  makeTessPipelineSources((ProgramSources *)local_1d0,&local_2c0,&local_2e0,&local_300,&local_2a0);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_100,pRVar4,(ProgramSources *)local_1d0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_120);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_140);
  lVar9 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_1d0 + lVar9));
    lVar9 = lVar9 + -0x18;
  } while (lVar9 != -0x18);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0._M_dataplus._M_p != paVar3) {
    operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_300._M_dataplus._M_p != &local_300.field_2) {
    operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
  }
  tcu::StringTemplate::~StringTemplate((StringTemplate *)&local_260);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._M_dataplus._M_p != paVar2) {
    operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
    operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
  }
  tcu::StringTemplate::~StringTemplate(&local_240);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_340._M_dataplus._M_p != &local_340.field_2) {
    operator_delete(local_340._M_dataplus._M_p,local_340.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
    operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
  }
  tcu::StringTemplate::~StringTemplate(&local_220);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_320._M_dataplus._M_p != &local_320.field_2) {
    operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
  }
  glu::operator<<((ctx->super_CallLogWrapper).m_log,(ShaderProgram *)local_100);
  local_1d0._0_8_ = local_1c0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1d0,
             "A link error is generated if a non-separable program has a tessellation control shader but no tessellation evaluation shader, unless GL_NV_gpu_shader5 is supported."
             ,"");
  NegativeTestContext::beginSection(ctx,(string *)local_1d0);
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d0._0_8_ !=
      local_1c0) {
    operator_delete((void *)local_1d0._0_8_,(ulong)(local_1c0[0]._M_dataplus._M_p + 1));
  }
  if (bVar6) {
    if (local_40 != false) goto LAB_005ea08b;
    local_1d0._0_8_ = local_1c0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1d0,"Program was expected to link","");
    NegativeTestContext::fail(ctx,(string *)local_1d0);
  }
  else {
    if (local_40 == false) goto LAB_005ea08b;
    local_1d0._0_8_ = local_1c0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1d0,"Program was not expected to link","");
    NegativeTestContext::fail(ctx,(string *)local_1d0);
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d0._0_8_ !=
      local_1c0) {
    operator_delete((void *)local_1d0._0_8_,(ulong)(local_1c0[0]._M_dataplus._M_p + 1));
  }
LAB_005ea08b:
  NegativeTestContext::endSection(ctx);
  glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_100);
  pRVar4 = ctx->m_renderCtx;
  local_320._M_dataplus._M_p = (pointer)&local_320.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_320,
             "${GLSL_VERSION_STRING}\n\nvoid main (void)\n{\n\tgl_Position = vec4(0.0);\n}\n","");
  tcu::StringTemplate::StringTemplate(&local_220,&local_320);
  tcu::StringTemplate::specialize
            (&local_2c0,&local_220,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&local_200);
  local_340._M_dataplus._M_p = (pointer)&local_340.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_340,
             "${GLSL_VERSION_STRING}\nprecision mediump float;\nlayout(location = 0) out mediump vec4 fragColor;\n\nvoid main (void)\n{\n\tfragColor = vec4(1.0);\n}\n"
             ,"");
  tcu::StringTemplate::StringTemplate(&local_240,&local_340);
  tcu::StringTemplate::specialize
            (&local_2e0,&local_240,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&local_200);
  local_280._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_280,
             "${GLSL_VERSION_STRING}\n${GLSL_TESS_EXTENSION_STRING}\nlayout (vertices=3) out;\n\nvoid main()\n{\n\tgl_out[gl_InvocationID].gl_Position = gl_in[gl_InvocationID].gl_Position;\n}\n"
             ,"");
  tcu::StringTemplate::StringTemplate((StringTemplate *)&local_260,&local_280);
  tcu::StringTemplate::specialize
            (&local_300,(StringTemplate *)&local_260,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&local_200);
  local_2a0._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a0,0x96985f);
  makeTessPipelineSources((ProgramSources *)local_1d0,&local_2c0,&local_2e0,&local_300,&local_2a0);
  local_108 = true;
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_100,pRVar4,(ProgramSources *)local_1d0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_120);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_140);
  lVar9 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_1d0 + lVar9));
    lVar9 = lVar9 + -0x18;
  } while (lVar9 != -0x18);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0._M_dataplus._M_p != paVar3) {
    operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_300._M_dataplus._M_p != &local_300.field_2) {
    operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
  }
  tcu::StringTemplate::~StringTemplate((StringTemplate *)&local_260);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._M_dataplus._M_p != paVar2) {
    operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
    operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
  }
  tcu::StringTemplate::~StringTemplate(&local_240);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_340._M_dataplus._M_p != &local_340.field_2) {
    operator_delete(local_340._M_dataplus._M_p,local_340.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
    operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
  }
  tcu::StringTemplate::~StringTemplate(&local_220);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_320._M_dataplus._M_p != &local_320.field_2) {
    operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
  }
  glu::operator<<((ctx->super_CallLogWrapper).m_log,(ShaderProgram *)local_100);
  if (local_40 == false) {
    pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar8,"failed to build program",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fNegativeTessellationTests.cpp"
               ,0x95);
    __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  glu::CallLogWrapper::glUseProgram(&ctx->super_CallLogWrapper,local_68);
  NegativeTestContext::expectError(ctx,0);
  local_1d0._0_8_ = local_1c0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1d0,
             "GL_INVALID_OPERATION is generated if current program state has tessellation control shader but no tessellation evaluation shader, unless GL_NV_gpu_shader5 is supported."
             ,"");
  NegativeTestContext::beginSection(ctx,(string *)local_1d0);
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d0._0_8_ !=
      local_1c0) {
    operator_delete((void *)local_1d0._0_8_,(ulong)(local_1c0[0]._M_dataplus._M_p + 1));
  }
  glu::CallLogWrapper::glDrawArrays(&ctx->super_CallLogWrapper,0xe,0,3);
  error = 0x502;
  if (bVar6) {
    error = 0;
  }
  NegativeTestContext::expectError(ctx,error);
  NegativeTestContext::endSection(ctx);
  glu::CallLogWrapper::glUseProgram(&ctx->super_CallLogWrapper,0);
  glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_100);
  pRVar4 = ctx->m_renderCtx;
  local_320._M_dataplus._M_p = (pointer)&local_320.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_320,
             "${GLSL_VERSION_STRING}\n\nvoid main (void)\n{\n\tgl_Position = vec4(0.0);\n}\n","");
  tcu::StringTemplate::StringTemplate(&local_220,&local_320);
  tcu::StringTemplate::specialize
            (&local_2c0,&local_220,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&local_200);
  local_340._M_dataplus._M_p = (pointer)&local_340.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_340,
             "${GLSL_VERSION_STRING}\nprecision mediump float;\nlayout(location = 0) out mediump vec4 fragColor;\n\nvoid main (void)\n{\n\tfragColor = vec4(1.0);\n}\n"
             ,"");
  tcu::StringTemplate::StringTemplate(&local_240,&local_340);
  tcu::StringTemplate::specialize
            (&local_2e0,&local_240,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&local_200);
  local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_300,0x96985f);
  local_2a0._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2a0,
             "${GLSL_VERSION_STRING}\n${GLSL_TESS_EXTENSION_STRING}\nlayout(triangles) in;\n\nvoid main()\n{\n\tgl_Position = gl_TessCoord[0] * gl_in[0].gl_Position;\n}\n"
             ,"");
  tcu::StringTemplate::StringTemplate((StringTemplate *)&local_280,&local_2a0);
  tcu::StringTemplate::specialize
            (&local_260,(StringTemplate *)&local_280,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&local_200);
  makeTessPipelineSources((ProgramSources *)local_1d0,&local_2c0,&local_2e0,&local_300,&local_260);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_100,pRVar4,(ProgramSources *)local_1d0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_120);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_140);
  lVar9 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_1d0 + lVar9));
    lVar9 = lVar9 + -0x18;
  } while (lVar9 != -0x18);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_260._M_dataplus._M_p != &local_260.field_2) {
    operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
  }
  tcu::StringTemplate::~StringTemplate((StringTemplate *)&local_280);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0._M_dataplus._M_p != paVar3) {
    operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_300._M_dataplus._M_p != &local_300.field_2) {
    operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
    operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
  }
  tcu::StringTemplate::~StringTemplate(&local_240);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_340._M_dataplus._M_p != &local_340.field_2) {
    operator_delete(local_340._M_dataplus._M_p,local_340.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
    operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
  }
  tcu::StringTemplate::~StringTemplate(&local_220);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_320._M_dataplus._M_p != &local_320.field_2) {
    operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
  }
  glu::operator<<((ctx->super_CallLogWrapper).m_log,(ShaderProgram *)local_100);
  local_1d0._0_8_ = local_1c0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1d0,
             "A link error is generated if a non-separable program has a tessellation evaluation shader but no tessellation control shader."
             ,"");
  NegativeTestContext::beginSection(ctx,(string *)local_1d0);
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d0._0_8_ !=
      local_1c0) {
    operator_delete((void *)local_1d0._0_8_,(ulong)(local_1c0[0]._M_dataplus._M_p + 1));
  }
  if (local_40 == true) {
    local_1d0._0_8_ = local_1c0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1d0,"Program was not expected to link","");
    NegativeTestContext::fail(ctx,(string *)local_1d0);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d0._0_8_ !=
        local_1c0) {
      operator_delete((void *)local_1d0._0_8_,(ulong)(local_1c0[0]._M_dataplus._M_p + 1));
    }
  }
  NegativeTestContext::endSection(ctx);
  glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_100);
  pRVar4 = ctx->m_renderCtx;
  local_320._M_dataplus._M_p = (pointer)&local_320.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_320,
             "${GLSL_VERSION_STRING}\n\nvoid main (void)\n{\n\tgl_Position = vec4(0.0);\n}\n","");
  tcu::StringTemplate::StringTemplate(&local_220,&local_320);
  tcu::StringTemplate::specialize
            (&local_2c0,&local_220,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&local_200);
  local_340._M_dataplus._M_p = (pointer)&local_340.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_340,
             "${GLSL_VERSION_STRING}\nprecision mediump float;\nlayout(location = 0) out mediump vec4 fragColor;\n\nvoid main (void)\n{\n\tfragColor = vec4(1.0);\n}\n"
             ,"");
  tcu::StringTemplate::StringTemplate(&local_240,&local_340);
  tcu::StringTemplate::specialize
            (&local_2e0,&local_240,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&local_200);
  local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_300,0x96985f);
  local_2a0._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2a0,
             "${GLSL_VERSION_STRING}\n${GLSL_TESS_EXTENSION_STRING}\nlayout(triangles) in;\n\nvoid main()\n{\n\tgl_Position = gl_TessCoord[0] * gl_in[0].gl_Position;\n}\n"
             ,"");
  tcu::StringTemplate::StringTemplate((StringTemplate *)&local_280,&local_2a0);
  tcu::StringTemplate::specialize
            (&local_260,(StringTemplate *)&local_280,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&local_200);
  makeTessPipelineSources((ProgramSources *)local_1d0,&local_2c0,&local_2e0,&local_300,&local_260);
  local_108 = true;
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_100,pRVar4,(ProgramSources *)local_1d0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_120);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_140);
  lVar9 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_1d0 + lVar9));
    lVar9 = lVar9 + -0x18;
  } while (lVar9 != -0x18);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_260._M_dataplus._M_p != &local_260.field_2) {
    operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
  }
  tcu::StringTemplate::~StringTemplate((StringTemplate *)&local_280);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0._M_dataplus._M_p != paVar3) {
    operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_300._M_dataplus._M_p != &local_300.field_2) {
    operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
    operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
  }
  tcu::StringTemplate::~StringTemplate(&local_240);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_340._M_dataplus._M_p != &local_340.field_2) {
    operator_delete(local_340._M_dataplus._M_p,local_340.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
    operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
  }
  tcu::StringTemplate::~StringTemplate(&local_220);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_320._M_dataplus._M_p != &local_320.field_2) {
    operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
  }
  glu::operator<<((ctx->super_CallLogWrapper).m_log,(ShaderProgram *)local_100);
  if (local_40 != false) {
    glu::CallLogWrapper::glUseProgram(&ctx->super_CallLogWrapper,local_68);
    NegativeTestContext::expectError(ctx,0);
    local_1d0._0_8_ = local_1c0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1d0,
               "GL_INVALID_OPERATION is generated if current program state has tessellation evaluation shader but no tessellation control shader."
               ,"");
    NegativeTestContext::beginSection(ctx,(string *)local_1d0);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d0._0_8_ !=
        local_1c0) {
      operator_delete((void *)local_1d0._0_8_,(ulong)(local_1c0[0]._M_dataplus._M_p + 1));
    }
    glu::CallLogWrapper::glDrawArrays(&ctx->super_CallLogWrapper,0xe,0,3);
    NegativeTestContext::expectError(ctx,0x502);
    NegativeTestContext::endSection(ctx);
    glu::CallLogWrapper::glUseProgram(&ctx->super_CallLogWrapper,0);
    glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_100);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&local_200);
    return;
  }
  pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar8,"failed to build program",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fNegativeTessellationTests.cpp"
             ,0xbe);
  __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void single_tessellation_stage (NegativeTestContext& ctx)
{
	const bool					isES32	= glu::contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2));
	const bool					requireTES = !ctx.getContextInfo().isExtensionSupported("GL_NV_gpu_shader5");
	map<string, string>			args;
	args["GLSL_VERSION_STRING"]			= isES32 ? getGLSLVersionDeclaration(glu::GLSL_VERSION_320_ES) : getGLSLVersionDeclaration(glu::GLSL_VERSION_310_ES);
	args["GLSL_TESS_EXTENSION_STRING"]	= isES32 ? "" : "#extension GL_EXT_tessellation_shader : require";

	checkTessellationSupport(ctx);

	{
		glu::ShaderProgram program(ctx.getRenderContext(),
								   makeTessPipelineSources(tcu::StringTemplate(vertexShaderSource).specialize(args),
														   tcu::StringTemplate(fragmentShaderSource).specialize(args),
														   tcu::StringTemplate(tessControlShaderSource).specialize(args),
														   "")); // missing tessEvalShaderSource
		tcu::TestLog& log = ctx.getLog();
		log << program;

		ctx.beginSection("A link error is generated if a non-separable program has a tessellation control shader but no tessellation evaluation shader, unless GL_NV_gpu_shader5 is supported.");

		if (requireTES && program.isOk())
			ctx.fail("Program was not expected to link");
		else if (!requireTES && !program.isOk())
			ctx.fail("Program was expected to link");

		ctx.endSection();
	}

	{
		glu::ShaderProgram program(ctx.getRenderContext(),
								   makeTessPipelineSources(tcu::StringTemplate(vertexShaderSource).specialize(args),
														   tcu::StringTemplate(fragmentShaderSource).specialize(args),
														   tcu::StringTemplate(tessControlShaderSource).specialize(args),
														   "") // missing tessEvalShaderSource
								   << glu::ProgramSeparable(true));
		tcu::TestLog& log = ctx.getLog();
		log << program;

		if (!program.isOk())
			TCU_THROW(TestError, "failed to build program");

		ctx.glUseProgram(program.getProgram());
		ctx.expectError(GL_NO_ERROR);

		ctx.beginSection("GL_INVALID_OPERATION is generated if current program state has tessellation control shader but no tessellation evaluation shader, unless GL_NV_gpu_shader5 is supported.");
		ctx.glDrawArrays(GL_PATCHES, 0, 3);
		ctx.expectError(requireTES ? GL_INVALID_OPERATION : GL_NO_ERROR);
		ctx.endSection();

		ctx.glUseProgram(0);
	}

	{
		glu::ShaderProgram program(ctx.getRenderContext(),
								   makeTessPipelineSources(tcu::StringTemplate(vertexShaderSource).specialize(args),
														   tcu::StringTemplate(fragmentShaderSource).specialize(args),
														   "", // missing tessControlShaderSource
														   tcu::StringTemplate(tessEvalShaderSource).specialize(args)));
		tcu::TestLog& log = ctx.getLog();
		log << program;

		ctx.beginSection("A link error is generated if a non-separable program has a tessellation evaluation shader but no tessellation control shader.");

		if (program.isOk())
			ctx.fail("Program was not expected to link");

		ctx.endSection();
	}

	{
		glu::ShaderProgram program(ctx.getRenderContext(),
								   makeTessPipelineSources(tcu::StringTemplate(vertexShaderSource).specialize(args),
														   tcu::StringTemplate(fragmentShaderSource).specialize(args),
														   "", // missing tessControlShaderSource
														   tcu::StringTemplate(tessEvalShaderSource).specialize(args))
									<< glu::ProgramSeparable(true));
		tcu::TestLog& log = ctx.getLog();
		log << program;

		if (!program.isOk())
			TCU_THROW(TestError, "failed to build program");

		ctx.glUseProgram(program.getProgram());
		ctx.expectError(GL_NO_ERROR);

		ctx.beginSection("GL_INVALID_OPERATION is generated if current program state has tessellation evaluation shader but no tessellation control shader.");
		ctx.glDrawArrays(GL_PATCHES, 0, 3);
		ctx.expectError(GL_INVALID_OPERATION);
		ctx.endSection();

		ctx.glUseProgram(0);
	}
}